

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_host.c
# Opt level: O3

int loader_host_register
              (loader_impl host,context ctx,char *name,loader_register_invoke invoke,function *func,
              type_id return_type,size_t arg_size,type_id *args_type_id)

{
  int iVar1;
  function_conflict func_00;
  signature s;
  char *pcVar2;
  type ptVar3;
  scope sp;
  value val;
  size_t iterator;
  size_t index;
  undefined4 in_stack_ffffffffffffffa8;
  
  func_00 = function_create(name,arg_size,invoke,function_host_singleton);
  iVar1 = 1;
  if (func_00 != (function_conflict)0x0) {
    s = function_signature(func_00);
    if (arg_size != 0) {
      index = 0;
      do {
        pcVar2 = type_id_name(args_type_id[index]);
        ptVar3 = loader_impl_type(host,pcVar2);
        signature_set(s,index,"",ptVar3);
        index = index + 1;
      } while (arg_size != index);
    }
    pcVar2 = type_id_name(return_type);
    ptVar3 = loader_impl_type(host,pcVar2);
    signature_set_return(s,ptVar3);
    if (name != (char *)0x0) {
      if (ctx == (context)0x0) {
        ctx = loader_impl_context(host);
      }
      sp = context_scope(ctx);
      val = value_create_function((function)CONCAT44(return_type,in_stack_ffffffffffffffa8));
      iVar1 = scope_define(sp,name,val);
      if (iVar1 != 0) {
        value_type_destroy(val);
        return 1;
      }
    }
    iVar1 = 0;
    if (func != (function *)0x0) {
      *func = func_00;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int loader_host_register(loader_impl host, context ctx, const char *name, loader_register_invoke invoke, function *func, type_id return_type, size_t arg_size, type_id args_type_id[])
{
	void **invoke_ptr = (void *)&invoke;

	function f = function_create(name, arg_size, *invoke_ptr, &function_host_singleton);

	if (f == NULL)
	{
		return 1;
	}

	signature s = function_signature(f);

	if (arg_size > 0)
	{
		size_t iterator;

		for (iterator = 0; iterator < arg_size; ++iterator)
		{
			static const char empty_argument_name[] = "";

			type t = loader_impl_type(host, type_id_name(args_type_id[iterator]));

			signature_set(s, iterator, empty_argument_name, t);
		}
	}

	type t = loader_impl_type(host, type_id_name(return_type));

	signature_set_return(s, t);

	if (name != NULL)
	{
		if (ctx == NULL)
		{
			ctx = loader_impl_context(host);
		}

		scope sp = context_scope(ctx);
		value v = value_create_function(f);

		if (scope_define(sp, name, v) != 0)
		{
			value_type_destroy(v);
			return 1;
		}
	}

	if (func != NULL)
	{
		*func = f;
	}

	return 0;
}